

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * __thiscall
duckdb::Exception::ConstructMessage<std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          LogicalType *params_1,LogicalType *params_2)

{
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  _Alloc_hider params_1_00;
  LogicalType local_70;
  undefined1 local_58 [24];
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> local_40;
  
  params_1_00._M_p = (pointer)0x0;
  ::std::__cxx11::string::string((string *)&local_40,(string *)msg);
  LogicalType::LogicalType((LogicalType *)local_58,(LogicalType *)params);
  LogicalType::LogicalType(&local_70,params_1);
  ConstructMessageRecursive<std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
            (__return_storage_ptr__,this,(string *)&stack0xffffffffffffff78,&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,&local_70
             ,(LogicalType *)params_1_00._M_p);
  LogicalType::~LogicalType(&local_70);
  LogicalType::~LogicalType((LogicalType *)local_58);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
          &stack0xffffffffffffff78);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}